

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDFaceParameter * __thiscall
ON_SubDMeshFragment::VertexSubDFaceParameter
          (ON_SubDFaceParameter *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid2dex_i,
          uint grid2dex_j)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ON_SubDFaceCornerDex cdex;
  ON_3dPoint debugP;
  ON_SubDFaceCornerDex local_44;
  ON_3dPoint local_40;
  
  bVar1 = (this->m_grid).m_side_segment_count;
  if (bVar1 == 0) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar7 = (bVar1 + 1) * grid2dex_j + grid2dex_i;
    uVar6 = 0xffffffff;
    if (grid2dex_j <= bVar1) {
      uVar6 = uVar7;
    }
    if (grid2dex_i <= bVar1) {
      uVar6 = uVar7;
    }
  }
  VertexPoint(&local_40,this,uVar6);
  bVar5 = ON_3dPoint::IsValid(&local_40);
  if (((bVar5) && (bVar1 = (this->m_grid).m_side_segment_count, bVar1 != 0)) &&
     (uVar6 = (uint)bVar1, grid2dex_j <= uVar6 && grid2dex_i <= uVar6)) {
    uVar7._0_2_ = this->m_face_fragment_count;
    uVar7._2_2_ = this->m_face_fragment_index;
    uVar8 = 4;
    if ((undefined2)uVar7 != 1) {
      uVar8 = uVar7;
    }
    if (2 < (ushort)uVar8) {
      uVar2 = this->m_face_fragment_index;
      if ((uVar8 & 0xffff) == 4) {
        if (uVar2 != 0) goto LAB_0060781d;
        ON_SubDFaceParameter::CreateFromQuadFaceParameteters
                  (__return_storage_ptr__,(double)(int)grid2dex_i * (1.0 / (double)uVar6),
                   (double)(int)grid2dex_j * (1.0 / (double)uVar6));
      }
      else {
        if ((ushort)uVar8 <= uVar2) goto LAB_0060781d;
        ON_SubDFaceCornerDex::ON_SubDFaceCornerDex(&local_44,(uint)uVar2,uVar8 & 0xffff);
        ON_SubDFaceParameter::ON_SubDFaceParameter
                  (__return_storage_ptr__,local_44,
                   (double)(int)grid2dex_i * (-0.5 / (double)uVar6) + 0.5,
                   (double)(int)grid2dex_j * (-0.5 / (double)uVar6) + 0.5);
      }
      bVar5 = ON_SubDFaceParameter::IsNotSet(__return_storage_ptr__);
      if (!bVar5) {
        return __return_storage_ptr__;
      }
    }
  }
LAB_0060781d:
  __return_storage_ptr__->m_t = ON_SubDFaceParameter::Nan.m_t;
  dVar4 = ON_SubDFaceParameter::Nan.m_s;
  uVar3 = ON_SubDFaceParameter::Nan._4_4_;
  __return_storage_ptr__->m_cdex = ON_SubDFaceParameter::Nan.m_cdex;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar3;
  __return_storage_ptr__->m_s = dVar4;
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDFaceParameter ON_SubDMeshFragment::VertexSubDFaceParameter(
  unsigned grid2dex_i,
  unsigned grid2dex_j
) const
{
  for (;;)
  {
    const ON_3dPoint debugP = VertexPoint(grid2dex_i, grid2dex_j);
    if (false == debugP.IsValid())
      break;


    const unsigned gc = m_grid.SideSegmentCount();
    if (gc < 1)
      break;
    if (grid2dex_i > gc || grid2dex_j > gc)
      break;

    // quad faces have m_face_fragment_count = 1;
    // n-gon faces have m_face_fragment_count = n (n = 3 or n >= 5)
    const unsigned face_edge_count 
      = (1 == m_face_fragment_count) 
      ? 4u
      : ((unsigned)m_face_fragment_count);

    if (face_edge_count < 3)
      break;

    if (4 == face_edge_count)
    {
      // quad face
      if (0 != m_face_fragment_index)
        break;
      // quad parameters run from 0.0 to 1.0.
      const double gdelta = 1.0 / ((double)gc);
      const double quad_s = gdelta * grid2dex_i;
      const double quad_t = gdelta * grid2dex_j;
      const ON_SubDFaceParameter p = ON_SubDFaceParameter::CreateFromQuadFaceParameteters(quad_s, quad_t);
      if (p.IsNotSet())
        break;
      return p;
    }

    // ngon face
    if (0 != m_face_fragment_index >= face_edge_count)
      break;
    // corner parameters run from 0.0 to 0.5.
    const double gdelta = 0.5 / ((double)gc);
    const double corner_s = 0.5 - gdelta * grid2dex_i;
    const double corner_t = 0.5 - gdelta * grid2dex_j;
    const ON_SubDFaceCornerDex cdex(m_face_fragment_index, face_edge_count);
    const ON_SubDFaceParameter p(cdex, corner_s, corner_t);
    if (p.IsNotSet())
      break;
    return p;
  }

  return ON_SubDFaceParameter::Nan;
}